

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * nlohmann::json_abi_v3_11_3::detail::dtoa_impl::append_exponent(char *buf,int e)

{
  byte bVar2;
  uint uVar1;
  char *pcVar3;
  ushort uVar4;
  byte *pbVar5;
  undefined8 uVar6;
  long lStack_10;
  
  if (e < -999) {
    pcVar3 = "e > -1000";
    uVar6 = 0x45ae;
LAB_00160636:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,uVar6,"GGML_ASSERT(%s) failed",pcVar3);
  }
  if (999 < e) {
    pcVar3 = "e < 1000";
    uVar6 = 0x45af;
    goto LAB_00160636;
  }
  uVar1 = -e;
  if (0 < e) {
    uVar1 = e;
  }
  *buf = (char)(e >> 0x1f) * -2 + '+';
  if (uVar1 < 10) {
    buf[1] = '0';
  }
  else {
    if (99 < uVar1) {
      uVar4 = (ushort)((uVar1 & 0xffff) % 100);
      buf[1] = (char)((uVar1 & 0xffff) / 100) + '0';
      bVar2 = (byte)(uVar4 % 10);
      pbVar5 = (byte *)(buf + 3);
      buf[2] = (byte)(uVar4 / 10) | 0x30;
      lStack_10 = 4;
      goto LAB_001605f3;
    }
    uVar4 = (ushort)uVar1 & 0xff;
    uVar1 = (uint)(byte)(uVar4 % 10);
    buf[1] = (byte)(uVar4 / 10) | 0x30;
  }
  pbVar5 = (byte *)(buf + 2);
  bVar2 = (byte)uVar1;
  lStack_10 = 3;
LAB_001605f3:
  *pbVar5 = bVar2 | 0x30;
  return buf + lStack_10;
}

Assistant:

inline char* append_exponent(char* buf, int e)
{
    JSON_ASSERT(e > -1000);
    JSON_ASSERT(e <  1000);

    if (e < 0)
    {
        e = -e;
        *buf++ = '-';
    }
    else
    {
        *buf++ = '+';
    }

    auto k = static_cast<std::uint32_t>(e);
    if (k < 10)
    {
        // Always print at least two digits in the exponent.
        // This is for compatibility with printf("%g").
        *buf++ = '0';
        *buf++ = static_cast<char>('0' + k);
    }
    else if (k < 100)
    {
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }
    else
    {
        *buf++ = static_cast<char>('0' + k / 100);
        k %= 100;
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }

    return buf;
}